

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O1

void __thiscall wasm::Wasm2JSGlue::emitPostES6(Wasm2JSGlue *this)

{
  Name *pNVar1;
  ExternalKind EVar2;
  pointer puVar3;
  _Head_base<0UL,_wasm::Function_*,_false> _Var4;
  char *pcVar5;
  pointer puVar6;
  _Head_base<0UL,_wasm::Memory_*,_false> _Var7;
  pointer puVar8;
  _Head_base<0UL,_wasm::Table_*,_false> _Var9;
  Export *pEVar10;
  ushort uVar11;
  Wasm2JSGlue *pWVar12;
  ostream *poVar13;
  size_type sVar14;
  Module *pMVar15;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *import_1;
  pointer puVar16;
  __node_base_ptr p_Var17;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  pointer puVar18;
  pointer puVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar38;
  int iVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  Name name;
  Name name_00;
  Name name_01;
  Name name_02;
  undefined1 local_f8 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  seenModules;
  string local_b8;
  string local_98;
  Wasm2JSGlue *local_78;
  string local_70;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pMVar15 = this->wasm;
  puVar16 = (pMVar15->memories).
            super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((puVar16 !=
       (pMVar15->memories).
       super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (*(char **)((long)&((puVar16->_M_t).
                         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                         super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->
                        super_Importable + 0x20) != (char *)0x0)) {
    poVar13 = &this->out->out;
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"var mem",7);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,(this->moduleName).super_IString.str._M_str,
                         (this->moduleName).super_IString.str._M_len);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," = new ArrayBuffer(",0x13);
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,");\n",3);
  }
  poVar13 = &this->out->out;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"var ret",7);
  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar13,(this->moduleName).super_IString.str._M_str,
                       (this->moduleName).super_IString.str._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," = ",3);
  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar13,(this->moduleName).super_IString.str._M_str,
                       (this->moduleName).super_IString.str._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"({\n",3);
  local_f8 = (undefined1  [8])&seenModules._M_h._M_rehash_policy._M_next_resize;
  seenModules._M_h._M_buckets = (__buckets_ptr)0x1;
  seenModules._M_h._M_bucket_count = 0;
  seenModules._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  seenModules._M_h._M_element_count._0_4_ = 0x3f800000;
  seenModules._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  seenModules._M_h._M_rehash_policy._4_4_ = 0;
  seenModules._M_h._M_rehash_policy._M_next_resize = 0;
  puVar3 = (this->wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_78 = this;
  for (puVar18 = (this->wasm->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar18 != puVar3; puVar18 = puVar18 + 1
      ) {
    _Var4._M_head_impl =
         (puVar18->_M_t).super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
         ._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    if (*(char **)((long)&(_Var4._M_head_impl)->super_Importable + 0x20) != (char *)0x0) {
      pcVar5 = *(char **)((long)&(_Var4._M_head_impl)->super_Importable + 0x30);
      iVar38 = (int)pcVar5;
      iVar39 = (int)((ulong)pcVar5 >> 0x20);
      auVar60._0_4_ = -(uint)((int)DAT_010d1468 == iVar38);
      auVar60._4_4_ = -(uint)((int)((ulong)DAT_010d1468 >> 0x20) == iVar39);
      auVar60._8_4_ = -(uint)((int)DAT_010d1478 == iVar38);
      auVar60._12_4_ = -(uint)((int)((ulong)DAT_010d1478 >> 0x20) == iVar39);
      auVar67._4_4_ = auVar60._0_4_;
      auVar67._0_4_ = auVar60._4_4_;
      auVar67._8_4_ = auVar60._12_4_;
      auVar67._12_4_ = auVar60._8_4_;
      auVar54._0_4_ = -(uint)((int)DAT_010d1438 == iVar38);
      auVar54._4_4_ = -(uint)((int)((ulong)DAT_010d1438 >> 0x20) == iVar39);
      auVar54._8_4_ = -(uint)((int)DAT_010d1448 == iVar38);
      auVar54._12_4_ = -(uint)((int)((ulong)DAT_010d1448 >> 0x20) == iVar39);
      auVar61._4_4_ = auVar54._0_4_;
      auVar61._0_4_ = auVar54._4_4_;
      auVar61._8_4_ = auVar54._12_4_;
      auVar61._12_4_ = auVar54._8_4_;
      auVar62 = packssdw(auVar61 & auVar54,auVar67 & auVar60);
      auVar45._0_4_ = -(uint)((int)DAT_010d1418 == iVar38);
      auVar45._4_4_ = -(uint)((int)((ulong)DAT_010d1418 >> 0x20) == iVar39);
      auVar45._8_4_ = -(uint)((int)DAT_010d1428 == iVar38);
      auVar45._12_4_ = -(uint)((int)((ulong)DAT_010d1428 >> 0x20) == iVar39);
      auVar55._4_4_ = auVar45._0_4_;
      auVar55._0_4_ = auVar45._4_4_;
      auVar55._8_4_ = auVar45._12_4_;
      auVar55._12_4_ = auVar45._8_4_;
      auVar48._0_4_ = -(uint)((int)DAT_010d13f8 == iVar38);
      auVar48._4_4_ = -(uint)((int)((ulong)DAT_010d13f8 >> 0x20) == iVar39);
      auVar48._8_4_ = -(uint)((int)DAT_010d1408 == iVar38);
      auVar48._12_4_ = -(uint)((int)((ulong)DAT_010d1408 >> 0x20) == iVar39);
      auVar46._4_4_ = auVar48._0_4_;
      auVar46._0_4_ = auVar48._4_4_;
      auVar46._8_4_ = auVar48._12_4_;
      auVar46._12_4_ = auVar48._8_4_;
      auVar47 = packssdw(auVar46 & auVar48,auVar55 & auVar45);
      auVar48 = packssdw(auVar47,auVar62);
      auVar31._0_4_ = -(uint)((int)DAT_010d1458 == iVar38);
      auVar31._4_4_ = -(uint)((int)((ulong)DAT_010d1458 >> 0x20) == iVar39);
      auVar31._8_4_ = -(uint)((int)DAT_010d13e8 == iVar38);
      auVar31._12_4_ = -(uint)((int)((ulong)DAT_010d13e8 >> 0x20) == iVar39);
      auVar40._4_4_ = auVar31._0_4_;
      auVar40._0_4_ = auVar31._4_4_;
      auVar40._8_4_ = auVar31._12_4_;
      auVar40._12_4_ = auVar31._8_4_;
      auVar33._0_4_ = -(uint)((int)DAT_010d13c8 == iVar38);
      auVar33._4_4_ = -(uint)((int)((ulong)DAT_010d13c8 >> 0x20) == iVar39);
      auVar33._8_4_ = -(uint)((int)DAT_010d13d8 == iVar38);
      auVar33._12_4_ = -(uint)((int)((ulong)DAT_010d13d8 >> 0x20) == iVar39);
      auVar32._4_4_ = auVar33._0_4_;
      auVar32._0_4_ = auVar33._4_4_;
      auVar32._8_4_ = auVar33._12_4_;
      auVar32._12_4_ = auVar33._8_4_;
      auVar33 = packssdw(auVar32 & auVar33,auVar40 & auVar31);
      auVar62._0_4_ = -(uint)((int)DAT_010d13a8 == iVar38);
      auVar62._4_4_ = -(uint)((int)((ulong)DAT_010d13a8 >> 0x20) == iVar39);
      auVar62._8_4_ = -(uint)((int)DAT_010d13b8 == iVar38);
      auVar62._12_4_ = -(uint)((int)((ulong)DAT_010d13b8 >> 0x20) == iVar39);
      auVar26._4_4_ = auVar62._0_4_;
      auVar26._0_4_ = auVar62._4_4_;
      auVar26._8_4_ = auVar62._12_4_;
      auVar26._12_4_ = auVar62._8_4_;
      auVar47._0_4_ = -(uint)((int)DAT_010d1388 == iVar38);
      auVar47._4_4_ = -(uint)((int)((ulong)DAT_010d1388 >> 0x20) == iVar39);
      auVar47._8_4_ = -(uint)((int)DAT_010d1398 == iVar38);
      auVar47._12_4_ = -(uint)((int)((ulong)DAT_010d1398 >> 0x20) == iVar39);
      auVar51._4_4_ = auVar47._0_4_;
      auVar51._0_4_ = auVar47._4_4_;
      auVar51._8_4_ = auVar47._12_4_;
      auVar51._12_4_ = auVar47._8_4_;
      auVar47 = packssdw(auVar51 & auVar47,auVar26 & auVar62);
      auVar47 = packssdw(auVar47,auVar33);
      auVar47 = packsswb(auVar47,auVar48);
      uVar11 = (ushort)(SUB161(auVar47 >> 7,0) & 1) | (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar47[0xf] >> 7) << 0xf;
      pMVar15 = (Module *)(ulong)uVar11;
      if ((uVar11 == 0) && (pMVar15 = (Module *)&ABI::wasm2js::TRAP, DAT_010d1488 != pcVar5)) {
        pNVar1 = (Name *)((long)&(_Var4._M_head_impl)->super_Importable + 0x18);
        sVar14 = std::
                 _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)local_f8,pNVar1);
        if (sVar14 == 0) {
          poVar13 = &local_78->out->out;
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"  \"",3);
          name.super_IString.str._M_str = (char *)pMVar15;
          name.super_IString.str._M_len =
               (size_t)*(char **)((long)&(_Var4._M_head_impl)->super_Importable + 0x20);
          poVar13 = wasm::operator<<((wasm *)poVar13,
                                     *(ostream **)
                                      &((Name *)((long)&(_Var4._M_head_impl)->super_Importable +
                                                0x18))->super_IString,name);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\": ",3);
          pcVar5 = *(char **)((long)&(_Var4._M_head_impl)->super_Importable + 0x20);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,pcVar5,
                     pcVar5 + *(long *)&((Name *)((long)&(_Var4._M_head_impl)->super_Importable +
                                                 0x18))->super_IString);
          asmangle((string *)local_50,&local_70);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar13,(char *)local_50._0_8_,local_50._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,",\n",2);
          if ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               *)local_50._0_8_ !=
              (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               *)(local_50 + 0x10)) {
            operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          local_50._0_8_ = local_f8;
          std::
          _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                    ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)local_50._0_8_,pNVar1,local_50);
        }
      }
    }
  }
  puVar6 = (local_78->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar16 = (local_78->wasm->memories).
                 super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar6; puVar16 = puVar16 + 1
      ) {
    _Var7._M_head_impl =
         (puVar16->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
         _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
         super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    if (*(char **)((long)&(_Var7._M_head_impl)->super_Importable + 0x20) != (char *)0x0) {
      pcVar5 = *(char **)((long)&(_Var7._M_head_impl)->super_Importable + 0x30);
      iVar38 = (int)pcVar5;
      iVar39 = (int)((ulong)pcVar5 >> 0x20);
      auVar63._0_4_ = -(uint)((int)DAT_010d1468 == iVar38);
      auVar63._4_4_ = -(uint)((int)((ulong)DAT_010d1468 >> 0x20) == iVar39);
      auVar63._8_4_ = -(uint)((int)DAT_010d1478 == iVar38);
      auVar63._12_4_ = -(uint)((int)((ulong)DAT_010d1478 >> 0x20) == iVar39);
      auVar68._4_4_ = auVar63._0_4_;
      auVar68._0_4_ = auVar63._4_4_;
      auVar68._8_4_ = auVar63._12_4_;
      auVar68._12_4_ = auVar63._8_4_;
      auVar56._0_4_ = -(uint)((int)DAT_010d1438 == iVar38);
      auVar56._4_4_ = -(uint)((int)((ulong)DAT_010d1438 >> 0x20) == iVar39);
      auVar56._8_4_ = -(uint)((int)DAT_010d1448 == iVar38);
      auVar56._12_4_ = -(uint)((int)((ulong)DAT_010d1448 >> 0x20) == iVar39);
      auVar64._4_4_ = auVar56._0_4_;
      auVar64._0_4_ = auVar56._4_4_;
      auVar64._8_4_ = auVar56._12_4_;
      auVar64._12_4_ = auVar56._8_4_;
      auVar62 = packssdw(auVar64 & auVar56,auVar68 & auVar63);
      auVar49._0_4_ = -(uint)((int)DAT_010d1418 == iVar38);
      auVar49._4_4_ = -(uint)((int)((ulong)DAT_010d1418 >> 0x20) == iVar39);
      auVar49._8_4_ = -(uint)((int)DAT_010d1428 == iVar38);
      auVar49._12_4_ = -(uint)((int)((ulong)DAT_010d1428 >> 0x20) == iVar39);
      auVar57._4_4_ = auVar49._0_4_;
      auVar57._0_4_ = auVar49._4_4_;
      auVar57._8_4_ = auVar49._12_4_;
      auVar57._12_4_ = auVar49._8_4_;
      auVar41._0_4_ = -(uint)((int)DAT_010d13f8 == iVar38);
      auVar41._4_4_ = -(uint)((int)((ulong)DAT_010d13f8 >> 0x20) == iVar39);
      auVar41._8_4_ = -(uint)((int)DAT_010d1408 == iVar38);
      auVar41._12_4_ = -(uint)((int)((ulong)DAT_010d1408 >> 0x20) == iVar39);
      auVar50._4_4_ = auVar41._0_4_;
      auVar50._0_4_ = auVar41._4_4_;
      auVar50._8_4_ = auVar41._12_4_;
      auVar50._12_4_ = auVar41._8_4_;
      auVar47 = packssdw(auVar50 & auVar41,auVar57 & auVar49);
      auVar51 = packssdw(auVar47,auVar62);
      auVar34._0_4_ = -(uint)((int)DAT_010d1458 == iVar38);
      auVar34._4_4_ = -(uint)((int)((ulong)DAT_010d1458 >> 0x20) == iVar39);
      auVar34._8_4_ = -(uint)((int)DAT_010d13e8 == iVar38);
      auVar34._12_4_ = -(uint)((int)((ulong)DAT_010d13e8 >> 0x20) == iVar39);
      auVar42._4_4_ = auVar34._0_4_;
      auVar42._0_4_ = auVar34._4_4_;
      auVar42._8_4_ = auVar34._12_4_;
      auVar42._12_4_ = auVar34._8_4_;
      auVar27._0_4_ = -(uint)((int)DAT_010d13c8 == iVar38);
      auVar27._4_4_ = -(uint)((int)((ulong)DAT_010d13c8 >> 0x20) == iVar39);
      auVar27._8_4_ = -(uint)((int)DAT_010d13d8 == iVar38);
      auVar27._12_4_ = -(uint)((int)((ulong)DAT_010d13d8 >> 0x20) == iVar39);
      auVar35._4_4_ = auVar27._0_4_;
      auVar35._0_4_ = auVar27._4_4_;
      auVar35._8_4_ = auVar27._12_4_;
      auVar35._12_4_ = auVar27._8_4_;
      auVar62 = packssdw(auVar35 & auVar27,auVar42 & auVar34);
      auVar22._0_4_ = -(uint)((int)DAT_010d13a8 == iVar38);
      auVar22._4_4_ = -(uint)((int)((ulong)DAT_010d13a8 >> 0x20) == iVar39);
      auVar22._8_4_ = -(uint)((int)DAT_010d13b8 == iVar38);
      auVar22._12_4_ = -(uint)((int)((ulong)DAT_010d13b8 >> 0x20) == iVar39);
      auVar28._4_4_ = auVar22._0_4_;
      auVar28._0_4_ = auVar22._4_4_;
      auVar28._8_4_ = auVar22._12_4_;
      auVar28._12_4_ = auVar22._8_4_;
      auVar20._0_4_ = -(uint)((int)DAT_010d1388 == iVar38);
      auVar20._4_4_ = -(uint)((int)((ulong)DAT_010d1388 >> 0x20) == iVar39);
      auVar20._8_4_ = -(uint)((int)DAT_010d1398 == iVar38);
      auVar20._12_4_ = -(uint)((int)((ulong)DAT_010d1398 >> 0x20) == iVar39);
      auVar23._4_4_ = auVar20._0_4_;
      auVar23._0_4_ = auVar20._4_4_;
      auVar23._8_4_ = auVar20._12_4_;
      auVar23._12_4_ = auVar20._8_4_;
      auVar47 = packssdw(auVar23 & auVar20,auVar28 & auVar22);
      auVar47 = packssdw(auVar47,auVar62);
      auVar47 = packsswb(auVar47,auVar51);
      uVar11 = (ushort)(SUB161(auVar47 >> 7,0) & 1) | (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar47[0xf] >> 7) << 0xf;
      pMVar15 = (Module *)(ulong)uVar11;
      if ((uVar11 == 0) && (pMVar15 = (Module *)&ABI::wasm2js::TRAP, DAT_010d1488 != pcVar5)) {
        poVar13 = &local_78->out->out;
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"  \"",3);
        name_00.super_IString.str._M_str = (char *)pMVar15;
        name_00.super_IString.str._M_len =
             (size_t)*(char **)((long)&(_Var7._M_head_impl)->super_Importable + 0x20);
        poVar13 = wasm::operator<<((wasm *)poVar13,
                                   *(ostream **)
                                    &((Name *)((long)&(_Var7._M_head_impl)->super_Importable + 0x18)
                                     )->super_IString,name_00);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\": {\n",5);
        poVar13 = &local_78->out->out;
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"    ",4);
        pcVar5 = *(char **)((long)&(_Var7._M_head_impl)->super_Importable + 0x30);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,pcVar5,
                   pcVar5 + *(long *)&((Name *)((long)&(_Var7._M_head_impl)->super_Importable + 0x28
                                               ))->super_IString);
        asmangle((string *)local_50,&local_70);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,(char *)local_50._0_8_,local_50._8_8_);
        pWVar12 = local_78;
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,": { buffer : mem",0x10);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,(pWVar12->moduleName).super_IString.str._M_str,
                             (pWVar12->moduleName).super_IString.str._M_len);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," }\n",3);
        if ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
             *)local_50._0_8_ !=
            (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
             *)(local_50 + 0x10)) {
          operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(&pWVar12->out->out,"  },\n",5);
      }
    }
  }
  puVar8 = (local_78->wasm->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar19 = (local_78->wasm->tables).
                 super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pWVar12 = local_78, puVar19 != puVar8;
      puVar19 = puVar19 + 1) {
    _Var9._M_head_impl =
         (puVar19->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
         super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
    if (*(char **)((long)&(_Var9._M_head_impl)->super_Importable + 0x20) != (char *)0x0) {
      pcVar5 = *(char **)((long)&(_Var9._M_head_impl)->super_Importable + 0x30);
      iVar38 = (int)pcVar5;
      iVar39 = (int)((ulong)pcVar5 >> 0x20);
      auVar65._0_4_ = -(uint)((int)DAT_010d1468 == iVar38);
      auVar65._4_4_ = -(uint)((int)((ulong)DAT_010d1468 >> 0x20) == iVar39);
      auVar65._8_4_ = -(uint)((int)DAT_010d1478 == iVar38);
      auVar65._12_4_ = -(uint)((int)((ulong)DAT_010d1478 >> 0x20) == iVar39);
      auVar69._4_4_ = auVar65._0_4_;
      auVar69._0_4_ = auVar65._4_4_;
      auVar69._8_4_ = auVar65._12_4_;
      auVar69._12_4_ = auVar65._8_4_;
      auVar58._0_4_ = -(uint)((int)DAT_010d1438 == iVar38);
      auVar58._4_4_ = -(uint)((int)((ulong)DAT_010d1438 >> 0x20) == iVar39);
      auVar58._8_4_ = -(uint)((int)DAT_010d1448 == iVar38);
      auVar58._12_4_ = -(uint)((int)((ulong)DAT_010d1448 >> 0x20) == iVar39);
      auVar66._4_4_ = auVar58._0_4_;
      auVar66._0_4_ = auVar58._4_4_;
      auVar66._8_4_ = auVar58._12_4_;
      auVar66._12_4_ = auVar58._8_4_;
      auVar62 = packssdw(auVar66 & auVar58,auVar69 & auVar65);
      auVar52._0_4_ = -(uint)((int)DAT_010d1418 == iVar38);
      auVar52._4_4_ = -(uint)((int)((ulong)DAT_010d1418 >> 0x20) == iVar39);
      auVar52._8_4_ = -(uint)((int)DAT_010d1428 == iVar38);
      auVar52._12_4_ = -(uint)((int)((ulong)DAT_010d1428 >> 0x20) == iVar39);
      auVar59._4_4_ = auVar52._0_4_;
      auVar59._0_4_ = auVar52._4_4_;
      auVar59._8_4_ = auVar52._12_4_;
      auVar59._12_4_ = auVar52._8_4_;
      auVar43._0_4_ = -(uint)((int)DAT_010d13f8 == iVar38);
      auVar43._4_4_ = -(uint)((int)((ulong)DAT_010d13f8 >> 0x20) == iVar39);
      auVar43._8_4_ = -(uint)((int)DAT_010d1408 == iVar38);
      auVar43._12_4_ = -(uint)((int)((ulong)DAT_010d1408 >> 0x20) == iVar39);
      auVar53._4_4_ = auVar43._0_4_;
      auVar53._0_4_ = auVar43._4_4_;
      auVar53._8_4_ = auVar43._12_4_;
      auVar53._12_4_ = auVar43._8_4_;
      auVar47 = packssdw(auVar53 & auVar43,auVar59 & auVar52);
      auVar51 = packssdw(auVar47,auVar62);
      auVar36._0_4_ = -(uint)((int)DAT_010d1458 == iVar38);
      auVar36._4_4_ = -(uint)((int)((ulong)DAT_010d1458 >> 0x20) == iVar39);
      auVar36._8_4_ = -(uint)((int)DAT_010d13e8 == iVar38);
      auVar36._12_4_ = -(uint)((int)((ulong)DAT_010d13e8 >> 0x20) == iVar39);
      auVar44._4_4_ = auVar36._0_4_;
      auVar44._0_4_ = auVar36._4_4_;
      auVar44._8_4_ = auVar36._12_4_;
      auVar44._12_4_ = auVar36._8_4_;
      auVar29._0_4_ = -(uint)((int)DAT_010d13c8 == iVar38);
      auVar29._4_4_ = -(uint)((int)((ulong)DAT_010d13c8 >> 0x20) == iVar39);
      auVar29._8_4_ = -(uint)((int)DAT_010d13d8 == iVar38);
      auVar29._12_4_ = -(uint)((int)((ulong)DAT_010d13d8 >> 0x20) == iVar39);
      auVar37._4_4_ = auVar29._0_4_;
      auVar37._0_4_ = auVar29._4_4_;
      auVar37._8_4_ = auVar29._12_4_;
      auVar37._12_4_ = auVar29._8_4_;
      auVar62 = packssdw(auVar37 & auVar29,auVar44 & auVar36);
      auVar24._0_4_ = -(uint)((int)DAT_010d13a8 == iVar38);
      auVar24._4_4_ = -(uint)((int)((ulong)DAT_010d13a8 >> 0x20) == iVar39);
      auVar24._8_4_ = -(uint)((int)DAT_010d13b8 == iVar38);
      auVar24._12_4_ = -(uint)((int)((ulong)DAT_010d13b8 >> 0x20) == iVar39);
      auVar30._4_4_ = auVar24._0_4_;
      auVar30._0_4_ = auVar24._4_4_;
      auVar30._8_4_ = auVar24._12_4_;
      auVar30._12_4_ = auVar24._8_4_;
      auVar21._0_4_ = -(uint)((int)DAT_010d1388 == iVar38);
      auVar21._4_4_ = -(uint)((int)((ulong)DAT_010d1388 >> 0x20) == iVar39);
      auVar21._8_4_ = -(uint)((int)DAT_010d1398 == iVar38);
      auVar21._12_4_ = -(uint)((int)((ulong)DAT_010d1398 >> 0x20) == iVar39);
      auVar25._4_4_ = auVar21._0_4_;
      auVar25._0_4_ = auVar21._4_4_;
      auVar25._8_4_ = auVar21._12_4_;
      auVar25._12_4_ = auVar21._8_4_;
      auVar47 = packssdw(auVar25 & auVar21,auVar30 & auVar24);
      auVar47 = packssdw(auVar47,auVar62);
      auVar47 = packsswb(auVar47,auVar51);
      uVar11 = (ushort)(SUB161(auVar47 >> 7,0) & 1) | (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar47[0xf] >> 7) << 0xf;
      pMVar15 = (Module *)(ulong)uVar11;
      if ((uVar11 == 0) && (pMVar15 = (Module *)&ABI::wasm2js::TRAP, DAT_010d1488 != pcVar5)) {
        pNVar1 = (Name *)((long)&(_Var9._M_head_impl)->super_Importable + 0x18);
        sVar14 = std::
                 _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)local_f8,pNVar1);
        if (sVar14 == 0) {
          poVar13 = &local_78->out->out;
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"  \"",3);
          name_01.super_IString.str._M_str = (char *)pMVar15;
          name_01.super_IString.str._M_len =
               (size_t)*(char **)((long)&(_Var9._M_head_impl)->super_Importable + 0x20);
          poVar13 = wasm::operator<<((wasm *)poVar13,
                                     *(ostream **)
                                      &((Name *)((long)&(_Var9._M_head_impl)->super_Importable +
                                                0x18))->super_IString,name_01);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\": ",3);
          pcVar5 = *(char **)((long)&(_Var9._M_head_impl)->super_Importable + 0x20);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,pcVar5,
                     pcVar5 + *(long *)&((Name *)((long)&(_Var9._M_head_impl)->super_Importable +
                                                 0x18))->super_IString);
          asmangle((string *)local_50,&local_70);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar13,(char *)local_50._0_8_,local_50._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,",\n",2);
          if ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               *)local_50._0_8_ !=
              (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               *)(local_50 + 0x10)) {
            operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          local_50._0_8_ = local_f8;
          std::
          _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                    ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)local_50._0_8_,pNVar1,local_50);
        }
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(&local_78->out->out,"});\n",4);
  if ((pWVar12->flags).allowAsserts == false) {
    p_Var17 = (__node_base_ptr)
              (pWVar12->wasm->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    seenModules._M_h._M_single_bucket =
         (__node_base_ptr)
         (pWVar12->wasm->exports).
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (p_Var17 != seenModules._M_h._M_single_bucket) {
      do {
        EVar2 = ((((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true> *)
                  &p_Var17->_M_nxt)->
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->kind;
        if (((uint)EVar2 < 4) && (EVar2 != Table)) {
          poVar13 = &pWVar12->out->out;
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"export var ",0xb);
          pEVar10 = (((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>
                       *)&p_Var17->_M_nxt)->
                    super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)._M_t.
                    super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                    super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
          pcVar5 = *(char **)((long)&(pEVar10->name).super_IString + 8);
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,pcVar5,pcVar5 + *(long *)&(pEVar10->name).super_IString);
          asmangle((string *)local_50,&local_b8);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar13,(char *)local_50._0_8_,local_50._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13," = ret",6);
          name_02.super_IString.str._M_str = (char *)pMVar15;
          name_02.super_IString.str._M_len = (size_t)(pWVar12->moduleName).super_IString.str._M_str;
          poVar13 = wasm::operator<<((wasm *)poVar13,
                                     (ostream *)(pWVar12->moduleName).super_IString.str._M_len,
                                     name_02);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,".",1);
          pEVar10 = (((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>
                       *)&p_Var17->_M_nxt)->
                    super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)._M_t.
                    super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                    super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
          pcVar5 = *(char **)((long)&(pEVar10->name).super_IString + 8);
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_98,pcVar5,pcVar5 + *(long *)&(pEVar10->name).super_IString);
          asmangle(&local_70,&local_98);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar13,local_70._M_dataplus._M_p,local_70._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,";\n",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               *)local_50._0_8_ !=
              (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               *)(local_50 + 0x10)) {
            operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
        }
        p_Var17 = p_Var17 + 1;
      } while (p_Var17 != seenModules._M_h._M_single_bucket);
    }
  }
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_f8);
  return;
}

Assistant:

void Wasm2JSGlue::emitPostES6() {
  // Create an initial `ArrayBuffer` and populate it with static data.
  // Currently we use base64 encoding to encode static data and we decode it at
  // instantiation time.
  //
  // Note that the translation here expects that the lower values of this memory
  // can be used for conversions, so make sure there's at least one page.
  if (!wasm.memories.empty() && wasm.memories[0]->imported()) {
    out << "var mem" << moduleName.str << " = new ArrayBuffer("
        << wasm.memories[0]->initial.addr * Memory::kPageSize << ");\n";
  }

  // Actually invoke the `asmFunc` generated function, passing in all global
  // values followed by all imports
  out << "var ret" << moduleName.str << " = " << moduleName.str << "({\n";

  std::unordered_set<Name> seenModules;

  ModuleUtils::iterImportedFunctions(wasm, [&](Function* import) {
    // The special helpers are emitted in the glue, see code and comments
    // below.
    if (ABI::wasm2js::isHelper(import->base)) {
      return;
    }
    if (seenModules.count(import->module) > 0) {
      return;
    }
    out << "  \"" << import->module
        << "\": " << asmangle(import->module.toString()) << ",\n";
    seenModules.insert(import->module);
  });

  ModuleUtils::iterImportedMemories(wasm, [&](Memory* import) {
    // The special helpers are emitted in the glue, see code and comments
    // below.
    if (ABI::wasm2js::isHelper(import->base)) {
      return;
    }
    out << "  \"" << import->module << "\": {\n";
    out << "    " << asmangle(import->base.toString()) << ": { buffer : mem"
        << moduleName.str << " }\n";
    out << "  },\n";
  });

  ModuleUtils::iterImportedTables(wasm, [&](Table* import) {
    // The special helpers are emitted in the glue, see code and comments
    // below.
    if (ABI::wasm2js::isHelper(import->base)) {
      return;
    }
    if (seenModules.count(import->module) > 0) {
      return;
    }
    out << "  \"" << import->module
        << "\": " << asmangle(import->module.toString()) << ",\n";
    seenModules.insert(import->module);
  });

  out << "});\n";

  if (flags.allowAsserts) {
    return;
  }

  // And now that we have our returned instance, export all our functions
  // that are hanging off it.
  for (auto& exp : wasm.exports) {
    switch (exp->kind) {
      case ExternalKind::Function:
      case ExternalKind::Global:
      case ExternalKind::Memory:
        break;

      // Exported globals and function tables aren't supported yet
      default:
        continue;
    }
    out << "export var " << asmangle(exp->name.toString()) << " = ret"
        << moduleName << "." << asmangle(exp->name.toString()) << ";\n";
  }
}